

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O2

LispPTR LCPutIVValue(LispPTR object,LispPTR iv,LispPTR val)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  uint uVar4;
  ulong uVar5;
  int i;
  uint uVar6;
  
  if (atom_instance == 0) {
    LCinit();
  }
  uVar4 = *(ushort *)((ulong)(object >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  if ((*(uint *)((long)DTDspace + (ulong)uVar4 * 4 + (ulong)(uVar4 << 5)) & 0xfffffff) ==
      atom_instance) {
    pLVar2 = NativeAligned4FromLAddr(object);
    uVar4 = pLVar2[1];
    uVar5 = (ulong)(((uVar4 ^ iv) & 0x3ff) << 4);
    pLVar3 = (LispPTR *)((long)&LCIVCache->iNames + uVar5);
    if ((*(uint *)((long)&LCIVCache->iNames + uVar5) == uVar4) && (pLVar3[1] == iv)) {
      uVar6 = (uint)(ushort)pLVar3[2];
LAB_00127011:
      pLVar3 = NativeAligned4FromLAddr(pLVar2[2]);
      uVar4 = *(ushort *)((ulong)(MDStypetbl + (pLVar3[uVar6] >> 9)) ^ 2) & 0x7ff;
      if ((*(uint *)((long)DTDspace + (ulong)uVar4 * 4 + (ulong)(uVar4 << 5)) & 0xfffffff) !=
          atom_annotatedValue) {
        if ((-1 < *(short *)((ulong)(MDStypetbl + (val >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c)) {
          if (*Reclaim_cnt_word == 0) {
            rec_htfind(val,0);
          }
          else {
            htfind(val,0);
          }
        }
        uVar4 = pLVar3[uVar6];
        if ((-1 < *(short *)((ulong)(uVar4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          if (*Reclaim_cnt_word == 0) {
            rec_htfind(uVar4,1);
          }
          else {
            htfind(uVar4,1);
          }
        }
        pLVar3[uVar6] = val;
        return val;
      }
    }
    else if ((*(ushort *)((ulong)(uVar4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
      uVar6 = 0;
      do {
        LVar1 = car(uVar4);
        if (LVar1 == iv) {
          *pLVar3 = pLVar2[1];
          pLVar3[1] = iv;
          pLVar3[2] = uVar6 | 0xe0000;
          goto LAB_00127011;
        }
        uVar6 = uVar6 + 1;
        uVar4 = cdr(uVar4);
      } while (uVar4 != 0);
    }
  }
  lcfuncall(atom_PutIVValue_LCUFN,3,3);
  return 0xfffffffe;
}

Assistant:

LispPTR LCPutIVValue(LispPTR object, LispPTR iv, LispPTR val) {
  struct LCInstance *objptr;
  LispPTR *valptr;
  int index;

  LC_INIT;
  INSTANCE_OR_PUNT(object, atom_PutIVValue_LCUFN, 3);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  GET_IV_INDEX(objptr, iv, index, goto pnut);
  valptr = &(((LispPTR *)NativeAligned4FromLAddr(objptr->iDescrs))[index]);
  if (!LC_TYPEP(*valptr, atom_annotatedValue)) {
    FRPLPTR((*valptr), val);
    return val;
  }
pnut:
  RETCALL(atom_PutIVValue_LCUFN, 3);
  /*
    return LCPutActiveValue(object,*valptr,val);
  */
}